

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

void display_rune(wchar_t col,wchar_t row,_Bool cursor,wchar_t oid)

{
  uint8_t attr;
  quark_t q;
  char *str;
  char *str_00;
  undefined7 in_register_00000011;
  
  attr = curs_attrs[1][CONCAT71(in_register_00000011,cursor) & 0xffffffff];
  q = rune_note((long)oid);
  str = quark_str(q);
  str_00 = rune_name((long)oid);
  c_prt(attr,str_00,row,col);
  if (str != (char *)0x0) {
    c_put_str('\v',str,row,L'/');
    return;
  }
  return;
}

Assistant:

static void display_rune(int col, int row, bool cursor, int oid )
{
	uint8_t attr = curs_attrs[CURS_KNOWN][(int)cursor];
	const char *inscrip = quark_str(rune_note(oid));

	c_prt(attr, rune_name(oid), row, col);

	/* Show autoinscription if around */
	if (inscrip)
		c_put_str(COLOUR_YELLOW, inscrip, row, 47);
}